

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3TriggerColmask
              (Parse *pParse,Trigger *pTrigger,ExprList *pChanges,int isNew,int tr_tm,Table *pTab,
              int orconf)

{
  int iVar1;
  TriggerPrg *pTVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (; pTrigger != (Trigger *)0x0; pTrigger = pTrigger->pNext) {
    if ((0x6b - (pChanges == (ExprList *)0x0) == (uint)pTrigger->op) &&
       (((uint)pTrigger->tr_tm & tr_tm) != 0)) {
      iVar1 = checkColumnOverlap(pTrigger->pColumns,pChanges);
      if (iVar1 != 0) {
        pTVar2 = getRowTrigger(pParse,pTrigger,pTab,orconf);
        if (pTVar2 != (TriggerPrg *)0x0) {
          uVar3 = uVar3 | pTVar2->aColmask[(uint)isNew];
        }
      }
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3TriggerColmask(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int isNew,           /* 1 for new.* ref mask, 0 for old.* ref mask */
  int tr_tm,           /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int orconf           /* Default ON CONFLICT policy for trigger steps */
){
  const int op = pChanges ? TK_UPDATE : TK_DELETE;
  u32 mask = 0;
  Trigger *p;

  assert( isNew==1 || isNew==0 );
  for(p=pTrigger; p; p=p->pNext){
    if( p->op==op && (tr_tm&p->tr_tm)
     && checkColumnOverlap(p->pColumns,pChanges)
    ){
      TriggerPrg *pPrg;
      pPrg = getRowTrigger(pParse, p, pTab, orconf);
      if( pPrg ){
        mask |= pPrg->aColmask[isNew];
      }
    }
  }

  return mask;
}